

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

void nifti_image_write(nifti_image *nim)

{
  znzFile __ptr;
  znzFile fp;
  nifti_image *nim_local;
  
  __ptr = nifti_image_write_hdr_img(nim,1,"wb");
  if (__ptr != (znzFile)0x0) {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d niw: done with znzFile\n");
    }
    free(__ptr);
  }
  if (1 < g_opts.debug) {
    fprintf(_stderr,"-d nifti_image_write: done\n");
  }
  return;
}

Assistant:

void nifti_image_write( nifti_image *nim )
{
   znzFile fp = nifti_image_write_hdr_img(nim,1,"wb");
   if( fp ){
      if( g_opts.debug > 2 ) fprintf(stderr,"-d niw: done with znzFile\n");
      free(fp);
   }
   if( g_opts.debug > 1 ) fprintf(stderr,"-d nifti_image_write: done\n");
}